

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::Matches
          (TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this,ArgumentTuple *args)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 uVar3;
  int iVar4;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  peVar1 = (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
           super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
           super_MatcherBase<unsigned_short_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (peVar1,(args->super__Tuple_impl<0UL,_unsigned_short_&>).
                            super__Head_base<0UL,_unsigned_short_&,_false>._M_head_impl);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    peVar2 = (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_short_&>_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<unsigned_short_&>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar2,args);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }